

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTags(Config *config)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  bool bVar3;
  int iVar4;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *pvVar5;
  IRegistryHub *pIVar6;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  reference testCase;
  pointer pTVar7;
  TestCaseInfo *pTVar8;
  reference pbVar9;
  unsigned_long *puVar10;
  pointer ppVar11;
  TextAttributes *pTVar12;
  ulong uVar13;
  long lVar14;
  pointer ppVar15;
  size_type sVar16;
  ostream *poVar17;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var18;
  allocator local_251;
  string local_250 [32];
  pluralise local_230;
  allocator local_201;
  string local_200 [39];
  Colour local_1d9;
  ulong uStack_1d8;
  Colour colourGuard;
  size_t dots;
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [32];
  undefined1 local_170 [8];
  Text wrapper;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_110;
  const_iterator countItEnd;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_100;
  const_iterator countIt_1;
  int local_e4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_e0;
  _Self local_b8;
  _Self local_b0;
  iterator countIt;
  string local_a0 [8];
  string tagName;
  _Self local_80;
  const_iterator tagItEnd;
  const_iterator tagIt;
  unsigned_long local_60;
  size_t maxTagLen;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  tagCounts;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTests;
  Config *config_local;
  
  pvVar5 = Config::filters(config);
  bVar3 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (pvVar5);
  if (bVar3) {
    std::operator<<((ostream *)&std::cout,"All available tags:\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching tags:\n");
  }
  pIVar6 = getRegistryHub();
  iVar4 = (*pIVar6->_vptr_IRegistryHub[3])();
  this = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
         (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))();
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this);
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(this);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&maxTagLen);
  local_60 = 0;
  while (bVar3 = __gnu_cxx::operator!=
                           (&itEnd,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                    *)&tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count),
        bVar3) {
    pvVar5 = Config::filters(config);
    testCase = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
    bVar3 = matchesFilters(pvVar5,testCase);
    if (bVar3) {
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      pTVar8 = TestCase::getTestCaseInfo(pTVar7);
      tagItEnd._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pTVar8->tags);
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      pTVar8 = TestCase::getTestCaseInfo(pTVar7);
      local_80._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&pTVar8->tags);
      while (bVar3 = std::operator!=(&tagItEnd,&local_80), bVar3) {
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&tagItEnd);
        std::__cxx11::string::string(local_a0,(string *)pbVar9);
        countIt._M_node = (_Base_ptr)std::__cxx11::string::size();
        puVar10 = std::max<unsigned_long>(&local_60,(unsigned_long *)&countIt);
        local_60 = *puVar10;
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)&maxTagLen,(key_type *)local_a0);
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)&maxTagLen);
        bVar3 = std::operator==(&local_b0,&local_b8);
        if (bVar3) {
          local_e4 = 1;
          std::make_pair<std::__cxx11::string&,int>
                    (&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_e4);
          _Var18 = std::
                   map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                   ::insert<std::pair<std::__cxx11::string,int>>
                             ((map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                               *)&maxTagLen,&local_e0);
          countIt_1._M_node = (_Base_ptr)_Var18.first._M_node;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          ::~pair(&local_e0);
        }
        else {
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    ::operator->(&local_b0);
          ppVar11->second = ppVar11->second + 1;
        }
        std::__cxx11::string::~string(local_a0);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&tagItEnd);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  local_60 = local_60 + 4;
  if (0x46 < local_60) {
    local_60 = 0x46;
  }
  countItEnd._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&maxTagLen);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&local_100,(iterator *)&countItEnd);
  wrapper.lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       *)&maxTagLen);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator
            (&local_110,
             (iterator *)
             &wrapper.lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while (bVar3 = std::operator!=(&local_100,&local_110), bVar3) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator->(&local_100);
    std::operator+((char *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e1001);
    std::operator+(local_190,(char *)local_1b0);
    TextAttributes::TextAttributes((TextAttributes *)&dots);
    pTVar12 = TextAttributes::setIndent((TextAttributes *)&dots,2);
    pTVar12 = TextAttributes::setWidth(pTVar12,local_60);
    Text::Text((Text *)local_170,local_190,pTVar12);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string(local_1b0);
    operator<<((ostream *)&std::cout,(Text *)local_170);
    uVar1 = local_60;
    uStack_1d8 = 2;
    Text::last_abi_cxx11_((Text *)local_170);
    uVar13 = std::__cxx11::string::size();
    uVar2 = local_60;
    if (uVar13 < uVar1) {
      Text::last_abi_cxx11_((Text *)local_170);
      lVar14 = std::__cxx11::string::size();
      uStack_1d8 = (uVar2 - lVar14) + uStack_1d8;
    }
    Colour::Colour(&local_1d9,FileName);
    uVar13 = uStack_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,uVar13,'.',&local_201);
    std::operator<<((ostream *)&std::cout,local_200);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    Colour::~Colour(&local_1d9);
    ppVar15 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::operator->(&local_100);
    poVar17 = (ostream *)std::ostream::operator<<(&std::cout,ppVar15->second);
    std::operator<<(poVar17,"\n");
    Text::~Text((Text *)local_170);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_100);
  }
  sVar16 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&maxTagLen);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"tag",&local_251);
  pluralise::pluralise(&local_230,sVar16,(string *)local_250);
  poVar17 = operator<<((ostream *)&std::cout,&local_230);
  poVar17 = std::operator<<(poVar17,"\n");
  std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise(&local_230);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  sVar16 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)&maxTagLen);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&maxTagLen);
  return sVar16;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        if( config.filters().empty() )
            std::cout << "All available tags:\n";
        else
            std::cout << "Matching tags:\n";
        std::vector<TestCase> const& allTests = getRegistryHub().getTestCaseRegistry().getAllTests();
        std::vector<TestCase>::const_iterator it = allTests.begin(), itEnd = allTests.end();

        std::map<std::string, int> tagCounts;

        std::size_t maxTagLen = 0;

        for(; it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                            tagItEnd = it->getTestCaseInfo().tags.end();
                        tagIt != tagItEnd;
                        ++tagIt ) {
                    std::string tagName = *tagIt;
                    maxTagLen = (std::max)( maxTagLen, tagName.size() );
                    std::map<std::string, int>::iterator countIt = tagCounts.find( tagName );
                    if( countIt == tagCounts.end() )
                        tagCounts.insert( std::make_pair( tagName, 1 ) );
                    else
                        countIt->second++;
                }
            }
        }
        maxTagLen +=4;
        if( maxTagLen > CATCH_CONFIG_CONSOLE_WIDTH-10 )
            maxTagLen = CATCH_CONFIG_CONSOLE_WIDTH-10;

        for( std::map<std::string, int>::const_iterator countIt = tagCounts.begin(), countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            Text wrapper( "[" + countIt->first + "]", TextAttributes()
                                                        .setIndent(2)
                                                        .setWidth( maxTagLen ) );
            std::cout << wrapper;
            std::size_t dots = 2;
            if( maxTagLen > wrapper.last().size() )
                dots += maxTagLen - wrapper.last().size();
            {
                Colour colourGuard( Colour::SecondaryText );
                std::cout << std::string( dots, '.' );
            }
            std::cout   << countIt->second
                        << "\n";
        }
        std::cout << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }